

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O0

void __thiscall xe::TestResultParser::TestResultParser(TestResultParser *this)

{
  TestResultParser *this_local;
  
  xml::Parser::Parser(&this->m_xmlParser);
  this->m_result = (TestCaseResult *)0x0;
  this->m_state = STATE_NOT_INITIALIZED;
  this->m_logVersion = TESTLOGVERSION_LAST;
  std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>::vector(&this->m_itemStack);
  this->m_curItemList = (List *)0x0;
  this->m_base64DecodeOffset = 0;
  std::__cxx11::string::string((string *)&this->m_curNumValue);
  return;
}

Assistant:

TestResultParser::TestResultParser (void)
	: m_result				(DE_NULL)
	, m_state				(STATE_NOT_INITIALIZED)
	, m_logVersion			(TESTLOGVERSION_LAST)
	, m_curItemList			(DE_NULL)
	, m_base64DecodeOffset	(0)
{
}